

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

void asciidump(void *buf,int len)

{
  ulong uVar1;
  
  puts("\nASCII dump");
  if (0 < len) {
    uVar1 = 0;
    do {
      putc((uint)*(byte *)((long)buf + uVar1),_stdout);
      uVar1 = uVar1 + 1;
      if ((uVar1 & 3) == 0) {
        putchar(0x20);
      }
      if ((uVar1 & 0x1f) == 0) {
        putchar(10);
      }
    } while ((uint)len != uVar1);
  }
  putchar(10);
  return;
}

Assistant:

void asciidump(void *buf, int len)
{
        int n;
        unsigned char *p = buf;

        printf("\nASCII dump\n");

        for (n = 0; n < len; n++) {
		putc(p[n], stdout);

                if ((n + 1) % 4 == 0)
                        printf(" ");
                if ((n + 1) % 32 == 0)
                        printf("\n");
        }
        printf("\n");
}